

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStringEq
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StringEq *curr)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  bool bVar5;
  anon_union_16_6_1532cd5a_for_Literal_0 local_128;
  undefined8 local_118;
  Literal right;
  pointer local_d8;
  char *pcStack_d0;
  undefined1 local_c8 [8];
  Literal left;
  undefined1 local_a0 [8];
  Flow flow;
  shared_ptr<wasm::GCData> leftData;
  shared_ptr<wasm::GCData> rightData;
  
  visit((Flow *)local_a0,this,*(Expression **)(curr + 0x18));
  if (flow.breakTo.super_IString.str._M_len == 0) {
    if (((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start -
               flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
        -0x5555555555555555 + (long)local_a0 != 1) {
LAB_0013bba9:
      __assert_fail("values.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                    ,0x52,"const Literal &wasm::Flow::getSingleValue()");
    }
    wasm::Literal::Literal((Literal *)local_c8,(Literal *)&flow);
    visit((Flow *)&stack0xfffffffffffffef0,this,*(Expression **)(curr + 0x20));
    SmallVector<wasm::Literal,_1UL>::operator=
              ((SmallVector<wasm::Literal,_1UL> *)local_a0,
               (SmallVector<wasm::Literal,_1UL> *)&stack0xfffffffffffffef0);
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_d8;
    flow.breakTo.super_IString.str._M_len = (size_t)pcStack_d0;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
              ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)&stack0xffffffffffffff10);
    wasm::Literal::~Literal(&right);
    if (flow.breakTo.super_IString.str._M_len == 0) {
      if (((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                        super__Vector_impl_data._M_start -
                 flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3)
          * -0x5555555555555555 + (long)local_a0 != 1) goto LAB_0013bba9;
      wasm::Literal::Literal((Literal *)&stack0xfffffffffffffef0,(Literal *)&flow);
      wasm::Literal::getGCData();
      wasm::Literal::getGCData();
      if (*(int *)(curr + 0x10) == 0) {
        bVar5 = flow.breakTo.super_IString.str._M_str == (char *)0x0 &&
                leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0 &&
            flow.breakTo.super_IString.str._M_str != (char *)0x0) {
          bVar5 = SmallVector<wasm::Literal,_1UL>::operator==
                            ((SmallVector<wasm::Literal,_1UL> *)
                             (flow.breakTo.super_IString.str._M_str + 8),
                             (SmallVector<wasm::Literal,_1UL> *)
                             &(leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount._M_pi)->_M_use_count);
        }
        local_128.i32 = (int32_t)bVar5;
      }
      else {
        if (*(int *)(curr + 0x10) != 1) {
          wasm::handle_unreachable
                    ("bad op",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                     ,0x8fd);
        }
        if (flow.breakTo.super_IString.str._M_str == (char *)0x0 ||
            leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          (*this->_vptr_ExpressionRunner[2])(this,"null ref");
        }
        if ((*(long *)(flow.breakTo.super_IString.str._M_str + 0x30) -
             *(long *)(flow.breakTo.super_IString.str._M_str + 0x28) >> 3) * -0x5555555555555555 +
            *(long *)(flow.breakTo.super_IString.str._M_str + 8) == 0) {
          uVar1 = 0;
        }
        else {
          left.type.id = (uintptr_t)(flow.breakTo.super_IString.str._M_str + 0x10);
          uVar1 = 0;
          uVar4 = 1;
          do {
            if (((long)leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi[3]._vptr__Sp_counted_base -
                 *(long *)&leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi[2]._M_use_count >> 3) * -0x5555555555555555 +
                *(long *)&(leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->_M_use_count == uVar1) {
LAB_0013bb1a:
              local_128.i32 = 1;
              goto LAB_0013bb26;
            }
            lVar2 = wasm::Literal::getInteger();
            lVar3 = wasm::Literal::getInteger();
            if (lVar2 < lVar3) {
              local_128.i32 = 0xffffffff;
              goto LAB_0013bb26;
            }
            if (lVar3 < lVar2) goto LAB_0013bb1a;
            uVar1 = (ulong)uVar4;
            uVar4 = uVar4 + 1;
          } while ((*(long *)(flow.breakTo.super_IString.str._M_str + 0x30) -
                    *(long *)(flow.breakTo.super_IString.str._M_str + 0x28) >> 3) *
                   -0x5555555555555555 + *(long *)(flow.breakTo.super_IString.str._M_str + 8) !=
                   uVar1);
        }
        local_128.i32 =
             -(uint)(((long)leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi[3]._vptr__Sp_counted_base -
                      *(long *)&leftData.
                                super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi[2]._M_use_count >> 3) * -0x5555555555555555 +
                     *(long *)&(leftData.
                                super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_M_use_count != uVar1);
      }
LAB_0013bb26:
      local_118 = 2;
      Flow::Flow(__return_storage_ptr__,(Literal *)&local_128.func);
      wasm::Literal::~Literal((Literal *)&local_128.func);
      if (rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   rightData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if (leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   leftData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      wasm::Literal::~Literal((Literal *)&stack0xfffffffffffffef0);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           (size_t)local_a0;
      wasm::Literal::Literal
                ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                 _M_elems,(Literal *)&flow);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
      flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len =
           (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                   super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str =
           (char *)flow.breakTo.super_IString.str._M_len;
    }
    wasm::Literal::~Literal((Literal *)local_c8);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_a0;
    wasm::Literal::Literal
              ((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems
               ,(Literal *)&flow);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)flow.breakTo.super_IString.str._M_len;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  wasm::Literal::~Literal((Literal *)&flow);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStringEq(StringEq* curr) {
    NOTE_ENTER("StringEq");
    Flow flow = visit(curr->left);
    if (flow.breaking()) {
      return flow;
    }
    auto left = flow.getSingleValue();
    flow = visit(curr->right);
    if (flow.breaking()) {
      return flow;
    }
    auto right = flow.getSingleValue();
    NOTE_EVAL2(left, right);
    auto leftData = left.getGCData();
    auto rightData = right.getGCData();
    int32_t result;
    switch (curr->op) {
      case StringEqEqual: {
        // They are equal if both are null, or both are non-null and equal.
        result =
          (!leftData && !rightData) ||
          (leftData && rightData && leftData->values == rightData->values);
        break;
      }
      case StringEqCompare: {
        if (!leftData || !rightData) {
          trap("null ref");
        }
        auto& leftValues = leftData->values;
        auto& rightValues = rightData->values;
        Index i = 0;
        while (1) {
          if (i == leftValues.size() && i == rightValues.size()) {
            // We reached the end, and they are equal.
            result = 0;
            break;
          } else if (i == leftValues.size()) {
            // The left string is short.
            result = -1;
            break;
          } else if (i == rightValues.size()) {
            result = 1;
            break;
          }
          auto left = leftValues[i].getInteger();
          auto right = rightValues[i].getInteger();
          if (left < right) {
            // The left character is lower.
            result = -1;
            break;
          } else if (left > right) {
            result = 1;
            break;
          } else {
            // Look further.
            i++;
          }
        }
        break;
      }
      default: {
        WASM_UNREACHABLE("bad op");
      }
    }
    return Literal(result);
  }